

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha256.c
# Opt level: O2

void HMAC_SHA256_Init_Y(HMAC_SHA256_CTX_Y *ctx,void *_K,size_t Klen)

{
  size_t sVar1;
  uchar pad [64];
  uchar local_48 [40];
  
  if (0x40 < Klen) {
    SHA256_Init_Y(&ctx->ictx);
    SHA256_Update_Y(&ctx->ictx,_K,Klen);
    _K = local_48;
    SHA256_Final_Y((uchar *)_K,&ctx->ictx);
    Klen = 0x20;
  }
  SHA256_Init_Y(&ctx->ictx);
  builtin_memcpy(pad + 0x30,"6666666666666666",0x10);
  builtin_memcpy(pad + 0x20,"6666666666666666",0x10);
  builtin_memcpy(pad + 0x10,"6666666666666666",0x10);
  builtin_memcpy(pad,"6666666666666666",0x10);
  for (sVar1 = 0; Klen != sVar1; sVar1 = sVar1 + 1) {
    pad[sVar1] = pad[sVar1] ^ *(byte *)((long)_K + sVar1);
  }
  SHA256_Update_Y(&ctx->ictx,pad,0x40);
  SHA256_Init_Y(&ctx->octx);
  builtin_memcpy(pad + 0x30,"\\\\\\\\\\\\\\\\\\\\\\\\\\\\\\\\",0x10);
  builtin_memcpy(pad + 0x20,"\\\\\\\\\\\\\\\\\\\\\\\\\\\\\\\\",0x10);
  builtin_memcpy(pad + 0x10,"\\\\\\\\\\\\\\\\\\\\\\\\\\\\\\\\",0x10);
  builtin_memcpy(pad,"\\\\\\\\\\\\\\\\\\\\\\\\\\\\\\\\",0x10);
  for (sVar1 = 0; Klen != sVar1; sVar1 = sVar1 + 1) {
    pad[sVar1] = pad[sVar1] ^ *(byte *)((long)_K + sVar1);
  }
  SHA256_Update_Y(&ctx->octx,pad,0x40);
  return;
}

Assistant:

void
HMAC_SHA256_Init_Y(HMAC_SHA256_CTX_Y * ctx, const void * _K, size_t Klen)
{
	unsigned char pad[64];
	unsigned char khash[32];
	const unsigned char * K = _K;
	size_t i;

	/* If Klen > 64, the key is really SHA256(K). */
	if (Klen > 64) {
		SHA256_Init_Y(&ctx->ictx);
		SHA256_Update_Y(&ctx->ictx, K, Klen);
		SHA256_Final_Y(khash, &ctx->ictx);
		K = khash;
		Klen = 32;
	}

	/* Inner SHA256 operation is SHA256(K xor [block of 0x36] || data). */
	SHA256_Init_Y(&ctx->ictx);
	memset(pad, 0x36, 64);
	for (i = 0; i < Klen; i++)
		pad[i] ^= K[i];
	SHA256_Update_Y(&ctx->ictx, pad, 64);

	/* Outer SHA256 operation is SHA256(K xor [block of 0x5c] || hash). */
	SHA256_Init_Y(&ctx->octx);
	memset(pad, 0x5c, 64);
	for (i = 0; i < Klen; i++)
		pad[i] ^= K[i];
	SHA256_Update_Y(&ctx->octx, pad, 64);

	/* Clean the stack. */
	memset(khash, 0, 32);
}